

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::GlobalOptions::GlobalOptions(GlobalOptions *this,Group *base,Base *options_)

{
  string local_50;
  code *local_30 [2];
  code *local_20;
  code *local_18;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_30[1] = (code *)0x0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_30[0] = Group::Validators::DontCare;
  local_18 = std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
             _M_invoke;
  local_20 = std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
             _M_manager;
  Group::Group(&this->super_Group,base,&local_50,(function<bool_(const_args::Group_&)> *)local_30,
               Global);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__Group_002025e8;
  Group::Add(&this->super_Group,options_);
  return;
}

Assistant:

GlobalOptions(Group &base, Base &options_) : Group(base, {}, Group::Validators::DontCare, Options::Global)
            {
                Add(options_);
            }